

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlParserInputBufferGrow(xmlParserInputBufferPtr in,int len)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  xmlChar *str;
  xmlBufPtr buf;
  size_t sVar5;
  uint uVar6;
  
  uVar6 = 0xffffffff;
  if ((in != (xmlParserInputBufferPtr)0x0) && (in->error == 0)) {
    iVar3 = 4000;
    if (len == 4) {
      iVar3 = len;
    }
    if (4000 < len) {
      iVar3 = len;
    }
    sVar4 = xmlBufAvail(in->buffer);
    if (sVar4 == 0) {
      xmlIOErr(0x60c,(char *)0x0);
      in->error = 0x60c;
    }
    else {
      iVar1 = xmlBufGrow(in->buffer,iVar3 + 1);
      if (iVar1 < 0) {
        xmlIOErrMemory("growing input buffer");
        in->error = 2;
      }
      else {
        str = xmlBufEnd(in->buffer);
        if (in->readcallback == (xmlInputReadCallback)0x0) {
          xmlIOErr(0x60b,(char *)0x0);
          in->error = 0x60b;
        }
        else {
          uVar2 = (*in->readcallback)(in->context,(char *)str,iVar3);
          if ((0 < (int)uVar2) || (in->readcallback = endOfInput, -1 < (int)uVar2)) {
            if ((in->compressed == -1) && (in->readcallback == xmlXzfileRead)) {
              iVar3 = __libxml2_xzcompressed(in->context);
              in->compressed = iVar3;
            }
            if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
              xmlBufAddLen(in->buffer,(ulong)uVar2);
              uVar6 = uVar2;
            }
            else {
              buf = in->raw;
              if (buf == (xmlBufPtr)0x0) {
                buf = xmlBufCreate();
                in->raw = buf;
              }
              iVar3 = xmlBufAdd(buf,str,uVar2);
              if (iVar3 == 0) {
                sVar4 = xmlBufUse(in->raw);
                uVar2 = xmlCharEncInput(in,1);
                if ((int)uVar2 < 0) {
                  xmlIOErr(0x608,(char *)0x0);
                  in->error = 0x608;
                }
                else {
                  sVar5 = xmlBufUse(in->raw);
                  in->rawconsumed = in->rawconsumed + ((sVar4 & 0xffffffff) - sVar5);
                  uVar6 = uVar2;
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

int
xmlParserInputBufferGrow(xmlParserInputBufferPtr in, int len) {
    char *buffer = NULL;
    int res = 0;
    int nbchars = 0;

    if ((in == NULL) || (in->error)) return(-1);
    if ((len <= MINLEN) && (len != 4))
        len = MINLEN;

    if (xmlBufAvail(in->buffer) <= 0) {
	xmlIOErr(XML_IO_BUFFER_FULL, NULL);
	in->error = XML_IO_BUFFER_FULL;
	return(-1);
    }

    if (xmlBufGrow(in->buffer, len + 1) < 0) {
        xmlIOErrMemory("growing input buffer");
        in->error = XML_ERR_NO_MEMORY;
        return(-1);
    }
    buffer = (char *)xmlBufEnd(in->buffer);

    /*
     * Call the read method for this I/O type.
     */
    if (in->readcallback != NULL) {
	res = in->readcallback(in->context, &buffer[0], len);
	if (res <= 0)
	    in->readcallback = endOfInput;
    } else {
	xmlIOErr(XML_IO_NO_INPUT, NULL);
	in->error = XML_IO_NO_INPUT;
	return(-1);
    }
    if (res < 0) {
	return(-1);
    }

    /*
     * try to establish compressed status of input if not done already
     */
    if (in->compressed == -1) {
#ifdef LIBXML_LZMA_ENABLED
	if (in->readcallback == xmlXzfileRead)
            in->compressed = __libxml2_xzcompressed(in->context);
#endif
    }

    len = res;
    if (in->encoder != NULL) {
        unsigned int use;

        /*
	 * Store the data in the incoming raw buffer
	 */
        if (in->raw == NULL) {
	    in->raw = xmlBufCreate();
	}
	res = xmlBufAdd(in->raw, (const xmlChar *) buffer, len);
	if (res != 0)
	    return(-1);

	/*
	 * convert as much as possible to the parser reading buffer.
	 */
	use = xmlBufUse(in->raw);
	nbchars = xmlCharEncInput(in, 1);
	if (nbchars < 0) {
	    xmlIOErr(XML_IO_ENCODER, NULL);
	    in->error = XML_IO_ENCODER;
	    return(-1);
	}
	in->rawconsumed += (use - xmlBufUse(in->raw));
    } else {
	nbchars = len;
        xmlBufAddLen(in->buffer, nbchars);
    }
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: read %d chars, buffer %d\n",
            nbchars, xmlBufUse(in->buffer));
#endif
    return(nbchars);
}